

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O1

int IDAGetDky(void *ida_mem,sunrealtype t,int k,N_Vector dky)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  char *msgfmt;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  sunrealtype cjk [6];
  sunrealtype cjk_1 [6];
  double local_a0 [14];
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar3 = -0x14;
    ida_mem = (IDAMem)0x0;
    iVar4 = -0x14;
    iVar5 = 0xc1c;
  }
  else if (dky == (N_Vector)0x0) {
    msgfmt = "dky = NULL illegal.";
    iVar3 = -0x1b;
    iVar4 = -0x1b;
    iVar5 = 0xc25;
  }
  else {
    if ((-1 < k) &&
       (iVar5 = *(int *)((long)ida_mem + 0x4bc) - k, k <= *(int *)((long)ida_mem + 0x4bc))) {
      dVar7 = *(double *)((long)ida_mem + 0x4f8);
      dVar9 = *(double *)((long)ida_mem + 0x4e0);
      dVar8 = (ABS(dVar9) + ABS(dVar7)) * *(double *)((long)ida_mem + 8) * 100.0;
      if ((t - ((dVar7 - *(double *)((long)ida_mem + 0x4e8)) -
               (double)(-(ulong)(dVar9 < 0.0) & (ulong)-dVar8 |
                       ~-(ulong)(dVar9 < 0.0) & (ulong)dVar8))) * dVar9 < 0.0) {
        IDAProcessError((IDAMem)ida_mem,-0x1a,0xc3a,"IDAGetDky",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                        ,
                        "Illegal value for t.t = %lg is not between tcur - hu = %lg and tcur = %lg."
                       );
        return -0x1a;
      }
      local_a0[5] = 0.0;
      local_a0[6] = 0.0;
      local_a0[3] = 0.0;
      local_a0[4] = 0.0;
      local_a0[1] = 0.0;
      local_a0[2] = 0.0;
      local_a0[7] = 0.0;
      local_a0[8] = 0.0;
      local_a0[9] = 0.0;
      local_a0[10] = 0.0;
      local_a0[0xb] = 0.0;
      local_a0[0xc] = 0.0;
      dVar7 = t - dVar7;
      iVar3 = 1;
      uVar6 = 0;
      local_a0[0] = dVar7;
      do {
        uVar1 = (uint)uVar6;
        iVar4 = iVar5 + uVar1;
        if ((int)(iVar5 + uVar1) <= iVar3) {
          iVar4 = iVar3;
        }
        if (uVar6 == 0) {
          local_a0[1] = 1.0;
          dVar9 = 0.0;
        }
        else {
          dVar9 = *(double *)((long)ida_mem + uVar6 * 8 + 0x180);
          local_a0[uVar6 + 1] = ((double)(int)uVar1 * local_a0[uVar6]) / dVar9;
        }
        if (0 < iVar5) {
          lVar2 = (long)iVar3 + -1;
          dVar8 = local_a0[iVar3];
          do {
            dVar10 = dVar9 + dVar7;
            dVar9 = *(double *)((long)ida_mem + lVar2 * 8 + 0x188);
            dVar8 = (local_a0[lVar2 + 7] * (double)(int)uVar1 + dVar10 * dVar8) / dVar9;
            local_a0[lVar2 + 2] = dVar8;
            lVar2 = lVar2 + 1;
          } while (lVar2 < (long)(uVar6 + (long)iVar5));
        }
        if (0 < iVar5) {
          memcpy(local_a0 + uVar6 + 8,local_a0 + uVar6 + 2,(ulong)(iVar4 + ~uVar1) * 8 + 8);
          dVar7 = local_a0[0];
        }
        uVar6 = uVar6 + 1;
        iVar3 = iVar3 + 1;
      } while (uVar6 != k + 1);
      iVar5 = N_VLinearCombination
                        (iVar5 + 1,local_a0 + (ulong)(uint)k + 1,
                         (long)ida_mem + (ulong)(uint)k * 8 + 0x158,dky);
      if (iVar5 != 0) {
        return -0x1c;
      }
      return 0;
    }
    msgfmt = "Illegal value for k.";
    iVar3 = -0x19;
    iVar4 = -0x19;
    iVar5 = 0xc2d;
  }
  IDAProcessError((IDAMem)ida_mem,iVar4,iVar5,"IDAGetDky",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return iVar3;
}

Assistant:

int IDAGetDky(void* ida_mem, sunrealtype t, int k, N_Vector dky)
{
  IDAMem IDA_mem;
  sunrealtype tfuzz, tp, delt, psij_1;
  int i, j, retval;
  sunrealtype cjk[MXORDP1];
  sunrealtype cjk_1[MXORDP1];

  /* Check ida_mem */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  if (dky == NULL)
  {
    IDAProcessError(IDA_mem, IDA_BAD_DKY, __LINE__, __func__, __FILE__,
                    MSG_NULL_DKY);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_DKY);
  }

  if ((k < 0) || (k > IDA_mem->ida_kused))
  {
    IDAProcessError(IDA_mem, IDA_BAD_K, __LINE__, __func__, __FILE__, MSG_BAD_K);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_K);
  }

  /* Check t for legality.  Here tn - hused is t_{n-1}. */

  tfuzz = HUNDRED * IDA_mem->ida_uround *
          (SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh));
  if (IDA_mem->ida_hh < ZERO) { tfuzz = -tfuzz; }
  tp = IDA_mem->ida_tn - IDA_mem->ida_hused - tfuzz;
  if ((t - tp) * IDA_mem->ida_hh < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_BAD_T, __LINE__, __func__, __FILE__, MSG_BAD_T,
                    t, IDA_mem->ida_tn - IDA_mem->ida_hused, IDA_mem->ida_tn);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_BAD_T);
  }

  /* Initialize the c_j^(k) and c_k^(k-1) */
  for (i = 0; i < MXORDP1; i++)
  {
    cjk[i]   = 0;
    cjk_1[i] = 0;
  }

  delt = t - IDA_mem->ida_tn;

  for (i = 0; i <= k; i++)
  {
    /* The below reccurence is used to compute the k-th derivative of the solution:
       c_j^(k) = ( k * c_{j-1}^(k-1) + c_{j-1}^{k} (Delta+psi_{j-1}) ) / psi_j

       Translated in indexes notation:
       cjk[j] = ( k*cjk_1[j-1] + cjk[j-1]*(delt+psi[j-2]) ) / psi[j-1]

       For k=0, j=1: c_1 = c_0^(-1) + (delt+psi[-1]) / psi[0]

       In order to be able to deal with k=0 in the same way as for k>0, the
       following conventions were adopted:
         - c_0(t) = 1 , c_0^(-1)(t)=0
         - psij_1 stands for psi[-1]=0 when j=1
                         for psi[j-2]  when j>1
    */
    if (i == 0)
    {
      cjk[i] = 1;
      psij_1 = 0;
    }
    else
    {
      /*                                                i       i-1          1
        c_i^(i) can be always updated since c_i^(i) = -----  --------  ... -----
                                                      psi_j  psi_{j-1}     psi_1
      */
      cjk[i] = cjk[i - 1] * i / IDA_mem->ida_psi[i - 1];
      psij_1 = IDA_mem->ida_psi[i - 1];
    }

    /* update c_j^(i) */

    /*j does not need to go till kused */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++)
    {
      cjk[j] = (i * cjk_1[j - 1] + cjk[j - 1] * (delt + psij_1)) /
               IDA_mem->ida_psi[j - 1];
      psij_1 = IDA_mem->ida_psi[j - 1];
    }

    /* save existing c_j^(i)'s */
    for (j = i + 1; j <= IDA_mem->ida_kused - k + i; j++) { cjk_1[j] = cjk[j]; }
  }

  /* Compute sum (c_j(t) * phi(t)) */

  /* Sum j=k to j<=IDA_mem->ida_kused */
  retval = N_VLinearCombination(IDA_mem->ida_kused - k + 1, cjk + k,
                                IDA_mem->ida_phi + k, dky);
  if (retval != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_VECTOROP_ERR);
  }

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}